

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type fmt::v5::format_to_n<char*,char[5],char[7]>
               (char *out,size_t n,char (*format_str) [5],char (*args) [7])

{
  char (*in_RDX) [5];
  type tVar1;
  char *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  basic_string_view<char> in_stack_00000018;
  format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char[7]>
  as;
  format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char[7]>
  *in_stack_ffffffffffffff78;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *this;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  local_48 [3];
  size_t local_10;
  size_t n_00;
  
  n_00 = local_10;
  internal::check_format_string<char[7],char[5]>(in_RDX);
  this = local_48;
  format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char[7]>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char[7]>
                      *)this,(char (*) [7])in_stack_ffffffffffffff78);
  to_string_view<char>((char *)0x19e4c7);
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  ::basic_format_args<char[7]>(this,in_stack_ffffffffffffff78);
  tVar1 = vformat_to_n<char*,char>(unaff_retaddr,n_00,in_stack_00000018,(type)in_stack_00000008);
  return tVar1;
}

Assistant:

format_to_n(OutputIt out, std::size_t n, const S &format_str,
                const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef FMT_CHAR(S) Char;
  format_arg_store<
      typename format_to_n_context<OutputIt, Char>::type, Args...> as(args...);
  return vformat_to_n(out, n, to_string_view(format_str),
                      typename format_to_n_args<OutputIt, Char>::type(as));
}